

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFPageLabelDocumentHelper.cc
# Opt level: O0

QPDFObjectHandle
QPDFPageLabelDocumentHelper::pageLabelDict
          (qpdf_page_label_e label_type,int start_num,string_view prefix)

{
  bool bVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  undefined4 in_register_0000003c;
  element_type *this;
  QPDFObjectHandle QVar3;
  QPDFObjectHandle local_1f0;
  allocator<char> local_1d9;
  string local_1d8;
  allocator<char> local_1b1;
  string local_1b0;
  QPDFObjectHandle local_190;
  allocator<char> local_179;
  string local_178;
  QPDFObjectHandle local_158;
  allocator<char> local_141;
  string local_140;
  QPDFObjectHandle local_120;
  allocator<char> local_109;
  string local_108;
  QPDFObjectHandle local_e8;
  allocator<char> local_d1;
  string local_d0;
  QPDFObjectHandle local_b0;
  allocator<char> local_99;
  string local_98;
  QPDFObjectHandle local_78 [2];
  allocator<char> local_51;
  string local_50;
  undefined1 local_29;
  int local_28;
  int local_24;
  int start_num_local;
  qpdf_page_label_e label_type_local;
  string_view prefix_local;
  QPDFObjectHandle *num;
  
  this = (element_type *)CONCAT44(in_register_0000003c,label_type);
  _start_num_local = prefix._M_str;
  local_28 = (int)prefix._M_len;
  local_29 = 0;
  local_24 = start_num;
  prefix_local._M_str = (char *)this;
  QPDFObjectHandle::newDictionary();
  switch(local_24) {
  case 0:
    break;
  case 1:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"/S",&local_51);
    operator____qpdf((char *)local_78,0x42cef5);
    QPDFObjectHandle::replaceKey((QPDFObjectHandle *)this,&local_50,local_78);
    QPDFObjectHandle::~QPDFObjectHandle(local_78);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator(&local_51);
    break;
  case 2:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"/S",&local_99);
    operator____qpdf((char *)&local_b0,0x42d30a);
    QPDFObjectHandle::replaceKey((QPDFObjectHandle *)this,&local_98,&local_b0);
    QPDFObjectHandle::~QPDFObjectHandle(&local_b0);
    std::__cxx11::string::~string((string *)&local_98);
    std::allocator<char>::~allocator(&local_99);
    break;
  case 3:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"/S",&local_d1);
    operator____qpdf((char *)&local_e8,0x42cfb2);
    QPDFObjectHandle::replaceKey((QPDFObjectHandle *)this,&local_d0,&local_e8);
    QPDFObjectHandle::~QPDFObjectHandle(&local_e8);
    std::__cxx11::string::~string((string *)&local_d0);
    std::allocator<char>::~allocator(&local_d1);
    break;
  case 4:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"/S",&local_109);
    operator____qpdf((char *)&local_120,0x42d30d);
    QPDFObjectHandle::replaceKey((QPDFObjectHandle *)this,&local_108,&local_120);
    QPDFObjectHandle::~QPDFObjectHandle(&local_120);
    std::__cxx11::string::~string((string *)&local_108);
    std::allocator<char>::~allocator(&local_109);
    break;
  case 5:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_140,"/S",&local_141);
    operator____qpdf((char *)&local_158,0x42d310);
    QPDFObjectHandle::replaceKey((QPDFObjectHandle *)this,&local_140,&local_158);
    QPDFObjectHandle::~QPDFObjectHandle(&local_158);
    std::__cxx11::string::~string((string *)&local_140);
    std::allocator<char>::~allocator(&local_141);
  }
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)&start_num_local);
  _Var2._M_pi = extraout_RDX;
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_178,"/P",&local_179);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_1b0,
               (basic_string_view<char,_std::char_traits<char>_> *)&start_num_local,&local_1b1);
    QPDFObjectHandle::newUnicodeString(&local_190,&local_1b0);
    QPDFObjectHandle::replaceKey((QPDFObjectHandle *)this,&local_178,&local_190);
    QPDFObjectHandle::~QPDFObjectHandle(&local_190);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::allocator<char>::~allocator(&local_1b1);
    std::__cxx11::string::~string((string *)&local_178);
    std::allocator<char>::~allocator(&local_179);
    _Var2._M_pi = extraout_RDX_00;
  }
  if (local_28 != 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,"/St",&local_1d9);
    QPDFObjectHandle::newInteger(&local_1f0,(long)local_28);
    QPDFObjectHandle::replaceKey((QPDFObjectHandle *)this,&local_1d8,&local_1f0);
    QPDFObjectHandle::~QPDFObjectHandle(&local_1f0);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::allocator<char>::~allocator(&local_1d9);
    _Var2._M_pi = extraout_RDX_01;
  }
  QVar3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var2._M_pi;
  QVar3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       this;
  return (QPDFObjectHandle)
         QVar3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDFPageLabelDocumentHelper::pageLabelDict(
    qpdf_page_label_e label_type, int start_num, std::string_view prefix)
{
    auto num = QPDFObjectHandle::newDictionary();
    switch (label_type) {
    case pl_none:
        break;
    case pl_digits:
        num.replaceKey("/S", "/D"_qpdf);
        break;
    case pl_alpha_lower:
        num.replaceKey("/S", "/a"_qpdf);
        break;
    case pl_alpha_upper:
        num.replaceKey("/S", "/A"_qpdf);
        break;
    case pl_roman_lower:
        num.replaceKey("/S", "/r"_qpdf);
        break;
    case pl_roman_upper:
        num.replaceKey("/S", "/R"_qpdf);
        break;
    }
    if (!prefix.empty()) {
        num.replaceKey("/P", QPDFObjectHandle::newUnicodeString(std::string(prefix)));
    }
    if (start_num != 1) {
        num.replaceKey("/St", QPDFObjectHandle::newInteger(start_num));
    }
    return num;
}